

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

bool double_conversion::ComputeGuess(Vector<const_char> trimmed,int exponent,double *guess)

{
  bool bVar1;
  int iVar2;
  double *in_RCX;
  int in_EDX;
  int in_ESI;
  double dVar3;
  double dVar4;
  Vector<const_char> in_stack_00000000;
  double *in_stack_00000090;
  int in_stack_0000009c;
  undefined1 in_stack_000000a0 [16];
  undefined4 in_stack_fffffffffffffff4;
  int in_stack_fffffffffffffffc;
  
  iVar2 = Vector<const_char>::length((Vector<const_char> *)&stack0xffffffffffffffe8);
  if (iVar2 == 0) {
    *in_RCX = 0.0;
  }
  else {
    iVar2 = Vector<const_char>::length((Vector<const_char> *)&stack0xffffffffffffffe8);
    if (in_EDX + iVar2 + -1 < 0x135) {
      iVar2 = Vector<const_char>::length((Vector<const_char> *)&stack0xffffffffffffffe8);
      if (in_EDX + iVar2 < -0x143) {
        *in_RCX = 0.0;
      }
      else {
        bVar1 = DoubleStrtod(in_stack_00000000,in_stack_fffffffffffffffc,
                             (double *)CONCAT44(in_stack_fffffffffffffff4,in_ESI));
        if ((!bVar1) &&
           (bVar1 = DiyFpStrtod((Vector<const_char>)in_stack_000000a0,in_stack_0000009c,
                                in_stack_00000090), !bVar1)) {
          dVar3 = *in_RCX;
          dVar4 = Double::Infinity();
          if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
            return true;
          }
          return false;
        }
      }
    }
    else {
      dVar3 = Double::Infinity();
      *in_RCX = dVar3;
    }
  }
  return true;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}